

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_BOOL qpdf_more_warnings(qpdf_data qpdf)

{
  list<QPDFExc,_std::allocator<QPDFExc>_> *plVar1;
  _List_node_base *p_Var2;
  vector<QPDFExc,_std::allocator<QPDFExc>_> w;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_28;
  
  plVar1 = &qpdf->warnings;
  p_Var2 = (qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)plVar1) {
    QPDF::getWarnings(&local_28,
                      (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_28.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_28.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
      _M_assign_dispatch<__gnu_cxx::__normal_iterator<QPDFExc*,std::vector<QPDFExc,std::allocator<QPDFExc>>>>
                ((list<QPDFExc,std::allocator<QPDFExc>> *)plVar1);
    }
    std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_28);
    p_Var2 = (plVar1->super__List_base<QPDFExc,_std::allocator<QPDFExc>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  return (QPDF_BOOL)(p_Var2 != (_List_node_base *)plVar1);
}

Assistant:

QPDF_BOOL
qpdf_more_warnings(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_more_warnings");

    if (qpdf->warnings.empty()) {
        std::vector<QPDFExc> w = qpdf->qpdf->getWarnings();
        if (!w.empty()) {
            qpdf->warnings.assign(w.begin(), w.end());
        }
    }
    if (qpdf->warnings.empty()) {
        return QPDF_FALSE;
    } else {
        return QPDF_TRUE;
    }
}